

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O0

bool __thiscall
ON_RenderContentPrivate::AddChild(ON_RenderContentPrivate *this,ON_RenderContent *child)

{
  ON_RenderContent *pOVar1;
  ON_RenderContent *last_child;
  ON_RenderContent *child_local;
  ON_RenderContentPrivate *this_local;
  
  if (((child->_private->m_model == (ONX_Model *)0x0) &&
      (child->_private->m_parent == (ON_RenderContent *)0x0)) &&
     (child->_private->m_next_sibling == (ON_RenderContent *)0x0)) {
    if (this->m_first_child == (ON_RenderContent *)0x0) {
      this->m_first_child = child;
    }
    else {
      pOVar1 = FindLastChild(this);
      if (pOVar1 == (ON_RenderContent *)0x0) {
        return false;
      }
      pOVar1->_private->m_next_sibling = child;
    }
    child->_private->m_next_sibling = (ON_RenderContent *)0x0;
    child->_private->m_parent = this->m_render_content;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_RenderContentPrivate::AddChild(ON_RenderContent& child)
{
  if ((nullptr != child._private->m_model) || (nullptr != child._private->m_parent) || (nullptr != child._private->m_next_sibling))
    return false;

  if (nullptr == m_first_child)
  {
    m_first_child = &child;
  }
  else
  {
    ON_RenderContent* last_child = FindLastChild();
    if (nullptr == last_child)
      return false;

    last_child->_private->m_next_sibling = &child;
  }

  child._private->m_next_sibling = nullptr;
  child._private->m_parent = &m_render_content;

  return true;
}